

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O0

void MGARD::switch_rows_2D_by_buffer<float>
               (float *data_pos,float *data_buffer,size_t n1,size_t n2,size_t stride)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int i_1;
  int i;
  float *cur_data_pos;
  float *coeff_data_buffer;
  float *nodal_data_buffer;
  size_t n1_coeff;
  size_t n1_nodal;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  
  lVar1 = (in_RDX >> 1) + 1;
  lVar2 = in_RSI + lVar1 * in_RCX * 4;
  local_50 = (void *)(in_RDI + in_R8 * 4);
  for (local_54 = 0; (ulong)(long)local_54 < in_RDX - lVar1; local_54 = local_54 + 1) {
    memcpy((void *)(lVar2 + local_54 * in_RCX * 4),local_50,in_RCX << 2);
    local_50 = (void *)(in_R8 * 4 + (long)local_50);
    memcpy((void *)(in_RSI + in_RCX * 4 + local_54 * in_RCX * 4),local_50,in_RCX << 2);
    local_50 = (void *)(in_R8 * 4 + (long)local_50);
  }
  if ((in_RDX & 1) == 0) {
    memcpy((void *)(lVar2 + in_RCX * -4),local_50,in_RCX << 2);
  }
  local_50 = (void *)(in_RDI + in_R8 * 4);
  for (local_58 = 1; (ulong)(long)local_58 < in_RDX; local_58 = local_58 + 1) {
    memcpy(local_50,(void *)(in_RSI + local_58 * in_RCX * 4),in_RCX << 2);
    local_50 = (void *)(in_R8 * 4 + (long)local_50);
  }
  return;
}

Assistant:

void switch_rows_2D_by_buffer(T * data_pos, T * data_buffer, size_t n1, size_t n2, size_t stride){
    size_t n1_nodal = (n1 >> 1) + 1;
    size_t n1_coeff = n1 - n1_nodal;
    T * nodal_data_buffer = data_buffer + n2; // skip the first nodal row
    T * coeff_data_buffer = data_buffer + n1_nodal * n2;
    T * cur_data_pos = data_pos + stride;
    for(int i=0; i<n1_coeff; i++){
        // copy coefficient rows
        memcpy(coeff_data_buffer + i * n2, cur_data_pos, n2 * sizeof(T));
        cur_data_pos += stride;
        // copy nodal rows
        memcpy(nodal_data_buffer + i * n2, cur_data_pos, n2 * sizeof(T));
        cur_data_pos += stride;
    }
    if(!(n1&1)){
        // n1 is even, move the last nodal row
        memcpy(coeff_data_buffer - n2, cur_data_pos, n2 * sizeof(T));
    }
    // copy data back
    cur_data_pos = data_pos + stride;
    for(int i=1; i<n1; i++){
        memcpy(cur_data_pos, data_buffer + i * n2, n2 * sizeof(T));
        cur_data_pos += stride;
    }
}